

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

unsigned_long tjBufSizeYUV2(int width,int pad,int height,int subsamp)

{
  int subsamp_00;
  int iVar1;
  int iVar2;
  char *__s;
  int in_ECX;
  int in_ESI;
  int ph;
  int stride;
  int pw;
  int i;
  int nc;
  unsigned_long_long retval;
  int local_28;
  unsigned_long local_8;
  
  local_8 = 0;
  if ((in_ECX < 0) || (5 < in_ECX)) {
    __s = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(__s,200,"%s","tjBufSizeYUV2(): Invalid argument");
    local_8 = 0xffffffffffffffff;
  }
  else {
    subsamp_00 = 3;
    if (in_ECX == 3) {
      subsamp_00 = 1;
    }
    for (local_28 = 0; local_28 < subsamp_00; local_28 = local_28 + 1) {
      iVar1 = tjPlaneWidth((int)(local_8 >> 0x20),(int)local_8,subsamp_00);
      iVar2 = tjPlaneHeight((int)(local_8 >> 0x20),(int)local_8,subsamp_00);
      if ((iVar1 < 0) || (iVar2 < 0)) {
        return 0xffffffffffffffff;
      }
      local_8 = (long)(int)((iVar1 + in_ESI) - 1U & (in_ESI - 1U ^ 0xffffffff)) * (long)iVar2 +
                local_8;
    }
  }
  return local_8;
}

Assistant:

DLLEXPORT unsigned long tjBufSizeYUV2(int width, int pad, int height,
                                      int subsamp)
{
  unsigned long long retval = 0;
  int nc, i;

  if (subsamp < 0 || subsamp >= NUMSUBOPT)
    THROWG("tjBufSizeYUV2(): Invalid argument");

  nc = (subsamp == TJSAMP_GRAY ? 1 : 3);
  for (i = 0; i < nc; i++) {
    int pw = tjPlaneWidth(i, width, subsamp);
    int stride = PAD(pw, pad);
    int ph = tjPlaneHeight(i, height, subsamp);

    if (pw < 0 || ph < 0) return -1;
    else retval += (unsigned long long)stride * ph;
  }
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("tjBufSizeYUV2(): Image is too large");

bailout:
  return (unsigned long)retval;
}